

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minAbs(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *__return_storage_ptr__,
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  uint *puVar1;
  undefined8 *puVar2;
  double a;
  undefined8 uVar3;
  uint uVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  char cVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_88;
  
  ::soplex::infinity::__tls_init();
  a = *(double *)(in_FS_OFFSET + -8);
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x3d) = 0;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)__return_storage_ptr__,a);
  lVar15 = (long)this->memused;
  if (0 < lVar15) {
    uVar16 = lVar15 + 1;
    lVar15 = lVar15 * 0x54 + -0xc;
    do {
      pNVar5 = this->m_elem;
      local_88.exp = *(int *)((long)(pNVar5->val).m_backend.data._M_elems + lVar15 + -8);
      local_88.neg = *(bool *)((long)(pNVar5->val).m_backend.data._M_elems + lVar15 + -4);
      local_88._72_8_ = *(undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar15);
      puVar1 = (uint *)((long)(pNVar5->val).m_backend.data._M_elems + lVar15 + -0x48);
      local_88.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)(pNVar5->val).m_backend.data._M_elems + lVar15 + -0x38);
      local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)(pNVar5->val).m_backend.data._M_elems + lVar15 + -0x28);
      local_88.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      puVar2 = (undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar15 + -0x18);
      uVar6 = *puVar2;
      uVar7 = puVar2[1];
      local_88.data._M_elems[0xc] = (uint)uVar6;
      local_88.data._M_elems[0xd] = (uint)((ulong)uVar6 >> 0x20);
      local_88.data._M_elems[0xe] = (uint)uVar7;
      local_88.data._M_elems[0xf] = (uint)((ulong)uVar7 >> 0x20);
      local_88.data._M_elems[10] = (uint)uVar3;
      local_88.data._M_elems[0xb] = (uint)((ulong)uVar3 >> 0x20);
      if ((local_88.neg == true) &&
         (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite)) {
        local_88.neg = false;
      }
      if (((local_88.fpclass != cpp_dec_float_NaN) &&
          ((__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_88,&__return_storage_ptr__->m_backend), iVar14 < 0)) {
        pNVar5 = this->m_elem;
        uVar4 = *(uint *)((long)(pNVar5->val).m_backend.data._M_elems + lVar15 + -0x48);
        puVar2 = (undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar15 + -0x18);
        uVar6 = puVar2[1];
        local_88.data._M_elems[0xc] = (uint)((ulong)*puVar2 >> 0x20);
        puVar2 = (undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar15 + -0x24);
        uVar7 = *puVar2;
        uVar8 = puVar2[1];
        local_88.data._M_elems[0xb] = (uint)((ulong)uVar8 >> 0x20);
        puVar2 = (undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar15 + -0x34);
        uVar9 = *puVar2;
        uVar10 = puVar2[1];
        puVar2 = (undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar15 + -0x44);
        uVar11 = *puVar2;
        uVar12 = puVar2[1];
        cVar13 = *(char *)((long)(pNVar5->val).m_backend.data._M_elems + lVar15 + -4);
        uVar3 = *(undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar15);
        if (cVar13 == '\x01') {
          cVar13 = (int)uVar3 == 0 && uVar4 == 0;
        }
        iVar14 = *(int *)((long)(pNVar5->val).m_backend.data._M_elems + lVar15 + -8);
        (__return_storage_ptr__->m_backend).data._M_elems[0] = uVar4;
        *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
             CONCAT44(local_88.data._M_elems[0xc],local_88.data._M_elems[0xb]);
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) = uVar6;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 9) = uVar7;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xb) = uVar8;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 5) = uVar9;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 7) = uVar10;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 1) = uVar11;
        *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 3) = uVar12;
        (__return_storage_ptr__->m_backend).exp = iVar14;
        (__return_storage_ptr__->m_backend).neg = (bool)cVar13;
        (__return_storage_ptr__->m_backend).fpclass = (int)uVar3;
        (__return_storage_ptr__->m_backend).prec_elem = (int)((ulong)uVar3 >> 0x20);
      }
      uVar16 = uVar16 - 1;
      lVar15 = lVar15 + -0x54;
    } while (1 < uVar16);
  }
  return __return_storage_ptr__;
}

Assistant:

R minAbs() const
   {
      R mini = R(infinity);

      for(int i = size() - 1; i >= 0; --i)
      {
         if(spxAbs(m_elem[i].val) < mini)
            mini = spxAbs(m_elem[i].val);
      }

      assert(mini >= 0);

      return mini;
   }